

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_hlsl_entry_point(CompilerHLSL *this)

{
  ParsedIR *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  uint __val;
  ExecutionModel EVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  uint uVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  mapped_type *pmVar8;
  SPIREntryPoint *pSVar9;
  SPIRConstant *pSVar10;
  CompilerError *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  string *psVar12;
  char *pcVar13;
  uint32_t uVar14;
  TypedID<(spirv_cross::Types)0> *pTVar15;
  uint32_t i;
  ulong uVar16;
  long lVar17;
  __node_base *p_Var18;
  TypedID<(spirv_cross::Types)0> *pTVar19;
  long lVar20;
  string y_expr;
  string x_expr;
  SpecializationConstant wg_y;
  string z_expr;
  bool legacy;
  undefined3 uStack_16f;
  SpecializationConstant wg_z;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arguments;
  
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &arguments.stack_storage;
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  arguments.buffer_capacity = 8;
  if (this->require_input == true) {
    ::std::__cxx11::string::string
              ((string *)&x_expr,"SPIRV_Cross_Input stage_input",(allocator *)&y_expr);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arguments,&x_expr);
    ::std::__cxx11::string::~string((string *)&x_expr);
  }
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar15 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  this_01 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  for (lVar17 = 0; sVar2 << 2 != lVar17; lVar17 = lVar17 + 4) {
    uVar5 = *(uint *)((long)&pTVar15->id + lVar17);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [uVar5].type == TypeVariable) {
      pSVar6 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,uVar5);
      pSVar7 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_01,&(pSVar7->super_IVariant).self);
      if (((((pSVar6->storage | StorageClassUniform) == StorageClassOutput) &&
           (((pmVar8->decoration).decoration_flags.lower & 4) != 0)) &&
          (bVar4 = Compiler::is_builtin_variable((Compiler *)this,pSVar6), !bVar4)) &&
         (bVar4 = Compiler::interface_variable_exists_in_entry_point
                            ((Compiler *)this,(pSVar6->super_IVariant).self.id), bVar4)) {
        if (pSVar6->storage == StorageClassOutput) {
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&legacy,this,(ulong)(pSVar6->super_IVariant).self.id);
          psVar12 = &z_expr;
          join<char_const(&)[13],std::__cxx11::string>
                    (psVar12,(spirv_cross *)"stage_output",(char (*) [13])&legacy,pbVar11);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                    (&y_expr,this,pSVar7,psVar12,0);
          join<char_const(&)[5],std::__cxx11::string>
                    (&x_expr,(spirv_cross *)0x305aac,(char (*) [5])&y_expr,psVar12);
        }
        else {
          if (pSVar6->storage != StorageClassInput) goto LAB_0025d232;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&legacy,this,(ulong)(pSVar6->super_IVariant).self.id);
          psVar12 = &z_expr;
          join<char_const(&)[12],std::__cxx11::string>
                    (psVar12,(spirv_cross *)0x31091d,(char (*) [12])&legacy,pbVar11);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])(&y_expr,this,pSVar7);
          join<char_const(&)[4],std::__cxx11::string>
                    (&x_expr,(spirv_cross *)"in ",(char (*) [4])&y_expr,psVar12);
        }
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&arguments,&x_expr);
        ::std::__cxx11::string::~string((string *)&x_expr);
        ::std::__cxx11::string::~string((string *)&y_expr);
        ::std::__cxx11::string::~string((string *)&z_expr);
        ::std::__cxx11::string::~string((string *)&legacy);
      }
    }
LAB_0025d232:
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&wg_y);
  pSVar9 = Compiler::get_entry_point((Compiler *)this);
  if (pSVar9->model == ExecutionModelFragment) {
    if (((pSVar9->flags).lower & 0x200) != 0) {
      CompilerGLSL::statement<char_const(&)[20]>
                (&this->super_CompilerGLSL,(char (*) [20])"[earlydepthstencil]");
    }
  }
  else if (pSVar9->model == ExecutionModelGLCompute) {
    _legacy = 0;
    wg_y.id.id = 0;
    wg_z.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              ((Compiler *)this,(SpecializationConstant *)&legacy,&wg_y,&wg_z);
    uVar5 = (pSVar9->workgroup_size).y;
    __val = (pSVar9->workgroup_size).z;
    if (_legacy == 0) {
      ::std::__cxx11::to_string(&x_expr,(pSVar9->workgroup_size).x);
    }
    else {
      pSVar10 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,_legacy);
      ::std::__cxx11::string::string
                ((string *)&x_expr,(string *)&pSVar10->specialization_constant_macro_name);
    }
    if (wg_y.id.id == 0) {
      ::std::__cxx11::to_string(&y_expr,uVar5);
    }
    else {
      pSVar10 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,wg_y.id.id);
      ::std::__cxx11::string::string
                ((string *)&y_expr,(string *)&pSVar10->specialization_constant_macro_name);
    }
    if (wg_z.id.id == 0) {
      ::std::__cxx11::to_string(&z_expr,__val);
    }
    else {
      pSVar10 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,wg_z.id.id);
      ::std::__cxx11::string::string
                ((string *)&z_expr,(string *)&pSVar10->specialization_constant_macro_name);
    }
    CompilerGLSL::
    statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])"[numthreads(",&x_expr,
               (char (*) [3])0x31b6f8,&y_expr,(char (*) [3])0x31b6f8,&z_expr,(char (*) [3])")]");
    ::std::__cxx11::string::~string((string *)&z_expr);
    ::std::__cxx11::string::~string((string *)&y_expr);
    ::std::__cxx11::string::~string((string *)&x_expr);
  }
  pcVar13 = "void ";
  if (this->require_output != false) {
    pcVar13 = "SPIRV_Cross_Output ";
  }
  y_expr._M_dataplus._M_p = pcVar13;
  merge(&x_expr,&arguments,", ");
  CompilerGLSL::statement<char_const*,char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char **)&y_expr,(char (*) [6])"main(",&x_expr,
             (char (*) [2])0x30ae46);
  ::std::__cxx11::string::~string((string *)&x_expr);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  legacy = *(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x1f;
  y_expr._M_string_length = (size_type)&legacy;
  y_expr._M_dataplus._M_p = (pointer)this;
  for (uVar16 = 0; uVar16 != 0x40; uVar16 = uVar16 + 1) {
    if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >> (uVar16 & 0x3f) &
        1) != 0) {
      emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                ((anon_class_16_2_46e5c3c4 *)&y_expr,(uint32_t)uVar16);
    }
  }
  sVar2 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
          _M_element_count;
  if (sVar2 != 0) {
    x_expr._M_dataplus._M_p = (pointer)((long)&x_expr.field_2 + 8);
    x_expr._M_string_length = 0;
    x_expr.field_2._M_allocated_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar2);
    p_Var18 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
               _M_before_begin;
    while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)&x_expr,(uint *)(p_Var18 + 1));
    }
    ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (x_expr._M_dataplus._M_p,x_expr._M_dataplus._M_p + x_expr._M_string_length * 4);
    _Var3 = x_expr._M_dataplus;
    lVar20 = x_expr._M_string_length << 2;
    for (lVar17 = 0; lVar20 != lVar17; lVar17 = lVar17 + 4) {
      emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                ((anon_class_16_2_46e5c3c4 *)&y_expr,*(uint32_t *)(_Var3._M_p + lVar17));
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&x_expr);
  }
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar15 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar19 = pTVar15 + (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  do {
    if (pTVar15 == pTVar19) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&y_expr);
      EVar1 = pSVar9->model;
      if (EVar1 == ExecutionModelGLCompute) {
        pcVar13 = "comp_main();";
      }
      else if (EVar1 == ExecutionModelFragment) {
        pcVar13 = "frag_main();";
      }
      else {
        if (EVar1 != ExecutionModelVertex) {
          this_02 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&x_expr,"Unsupported shader stage.",(allocator *)&y_expr);
          CompilerError::CompilerError(this_02,&x_expr);
          __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pcVar13 = "vert_main();";
      }
      CompilerGLSL::statement<char_const(&)[13]>(&this->super_CompilerGLSL,(char (*) [13])pcVar13);
      ParsedIR::create_loop_hard_lock(this_00);
      pTVar15 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
      for (lVar17 = 0; sVar2 << 2 != lVar17; lVar17 = lVar17 + 4) {
        uVar5 = *(uint *)((long)&pTVar15->id + lVar17);
        if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
            ptr[uVar5].type == TypeVariable) {
          pSVar6 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,uVar5);
          pSVar7 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
          pmVar8 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,&(pSVar7->super_IVariant).self);
          if (((pSVar6->storage == StorageClassOutput) &&
              (((pmVar8->decoration).decoration_flags.lower & 4) != 0)) &&
             ((bVar4 = Compiler::is_builtin_variable((Compiler *)this,pSVar6), !bVar4 &&
              (bVar4 = Compiler::interface_variable_exists_in_entry_point
                                 ((Compiler *)this,(pSVar6->super_IVariant).self.id), bVar4)))) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar6->super_IVariant).self.id,1);
            CompilerGLSL::
            statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [13])"stage_output",&x_expr,
                       (char (*) [4])0x31e8c7,&x_expr,(char (*) [2])0x304bae);
            ::std::__cxx11::string::~string((string *)&x_expr);
          }
        }
      }
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&y_expr);
      if (this->require_output == true) {
        CompilerGLSL::statement<char_const(&)[33]>
                  (&this->super_CompilerGLSL,(char (*) [33])"SPIRV_Cross_Output stage_output;");
        y_expr._M_dataplus._M_p = (pointer)this;
        for (uVar16 = 0; uVar16 != 0x40; uVar16 = uVar16 + 1) {
          if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >>
               (uVar16 & 0x3f) & 1) != 0) {
            emit_hlsl_entry_point::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&y_expr,(uint32_t)uVar16);
          }
        }
        sVar2 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
                _M_element_count;
        if (sVar2 != 0) {
          x_expr._M_dataplus._M_p = (pointer)((long)&x_expr.field_2 + 8);
          x_expr._M_string_length = 0;
          x_expr.field_2._M_allocated_capacity = 8;
          SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar2);
          p_Var18 = &(this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
                     _M_before_begin;
          while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
            SmallVector<unsigned_int,_8UL>::push_back
                      ((SmallVector<unsigned_int,_8UL> *)&x_expr,(uint *)(p_Var18 + 1));
          }
          ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                    (x_expr._M_dataplus._M_p,x_expr._M_dataplus._M_p + x_expr._M_string_length * 4);
          _Var3 = x_expr._M_dataplus;
          lVar20 = x_expr._M_string_length << 2;
          for (lVar17 = 0; lVar20 != lVar17; lVar17 = lVar17 + 4) {
            emit_hlsl_entry_point::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&y_expr,*(uint32_t *)(_Var3._M_p + lVar17));
          }
          SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&x_expr);
        }
        ParsedIR::create_loop_hard_lock(this_00);
        pTVar19 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        pTVar15 = pTVar19 + (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                            buffer_size;
        for (; pTVar19 != pTVar15; pTVar19 = pTVar19 + 1) {
          if ((this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.ptr[pTVar19->id].type == TypeVariable) {
            pSVar6 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,pTVar19->id);
            pSVar7 = Compiler::get<spirv_cross::SPIRType>
                               ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
            pmVar8 = ::std::__detail::
                     _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_01,&(pSVar7->super_IVariant).self);
            if (((pSVar6->storage == StorageClassOutput) &&
                (((pmVar8->decoration).decoration_flags.lower & 4) == 0)) &&
               ((pSVar6->remapped_variable == false &&
                (((pSVar7->pointer == true &&
                  (bVar4 = Compiler::is_builtin_variable((Compiler *)this,pSVar6), !bVar4)) &&
                 (bVar4 = Compiler::interface_variable_exists_in_entry_point
                                    ((Compiler *)this,(pSVar6->super_IVariant).self.id), bVar4))))))
            {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar6->super_IVariant).self.id,1);
              if ((legacy == true) && (pSVar9->model == ExecutionModelFragment)) {
                y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
                y_expr._M_string_length = 0;
                y_expr.field_2._M_local_buf[0] = '\0';
                for (uVar14 = pSVar7->vecsize; uVar14 < 4; uVar14 = uVar14 + 1) {
                  ::std::__cxx11::string::append((char *)&y_expr);
                }
                CompilerGLSL::
                statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",&x_expr,
                           (char (*) [11])" = float4(",&x_expr,&y_expr,(char (*) [3])0x304bad);
                ::std::__cxx11::string::~string((string *)&y_expr);
              }
              else {
                CompilerGLSL::
                statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",&x_expr,
                           (char (*) [4])0x31e8c7,&x_expr,(char (*) [2])0x304bae);
              }
              ::std::__cxx11::string::~string((string *)&x_expr);
            }
          }
        }
        ParsedIR::LoopLock::~LoopLock((LoopLock *)&z_expr);
        CompilerGLSL::statement<char_const(&)[21]>
                  (&this->super_CompilerGLSL,(char (*) [21])"return stage_output;");
      }
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector(&arguments);
      return;
    }
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [pTVar15->id].type == TypeVariable) {
      pSVar6 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,pTVar15->id);
      pSVar7 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_01,&(pSVar7->super_IVariant).self);
      if (pSVar6->storage == StorageClassInput) {
        if (((pmVar8->decoration).decoration_flags.lower & 4) == 0) {
          if ((pSVar6->remapped_variable == false) && (pSVar7->pointer == true)) {
            EVar1 = pSVar9->model;
            bVar4 = Compiler::is_builtin_variable((Compiler *)this,pSVar6);
            if ((!bVar4) &&
               (bVar4 = Compiler::interface_variable_exists_in_entry_point
                                  ((Compiler *)this,(pSVar6->super_IVariant).self.id), bVar4)) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar6->super_IVariant).self.id);
              pSVar7 = Compiler::get<spirv_cross::SPIRType>
                                 ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc)
              ;
              if ((EVar1 == ExecutionModelVertex) && (uVar5 = pSVar7->columns, 1 < uVar5)) {
                for (z_expr._M_dataplus._M_p._0_4_ = 0; (uint)z_expr._M_dataplus._M_p < uVar5;
                    z_expr._M_dataplus._M_p._0_4_ = (uint)z_expr._M_dataplus._M_p + 1) {
                  CompilerGLSL::
                  statement<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[17],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,&x_expr,(char (*) [2])0x31c69e,
                             (uint *)&z_expr,(char (*) [17])"] = stage_input.",&x_expr,
                             (char (*) [2])0x30ed65,(uint *)&z_expr,(char (*) [2])0x304bae);
                  uVar5 = pSVar7->columns;
                }
              }
              else {
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,&x_expr,(char (*) [16])0x31090a,&x_expr,
                           (char (*) [2])0x304bae);
              }
              goto LAB_0025d6d4;
            }
          }
        }
        else {
          bVar4 = Compiler::is_builtin_variable((Compiler *)this,pSVar6);
          if ((!bVar4) &&
             (bVar4 = Compiler::interface_variable_exists_in_entry_point
                                ((Compiler *)this,(pSVar6->super_IVariant).self.id), bVar4)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&x_expr,this,(ulong)(pSVar6->super_IVariant).self.id,1);
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[15],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,&x_expr,(char (*) [15])" = stage_input",&x_expr,
                       (char (*) [2])0x304bae);
LAB_0025d6d4:
            ::std::__cxx11::string::~string((string *)&x_expr);
          }
        }
      }
    }
    pTVar15 = pTVar15 + 1;
  } while( true );
}

Assistant:

void CompilerHLSL::emit_hlsl_entry_point()
{
	SmallVector<string> arguments;

	if (require_input)
		arguments.push_back("SPIRV_Cross_Input stage_input");

	// Add I/O blocks as separate arguments with appropriate storage qualifier.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

		if (var.storage != StorageClassInput && var.storage != StorageClassOutput)
			return;

		if (block && !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
		{
			if (var.storage == StorageClassInput)
			{
				arguments.push_back(join("in ", variable_decl(type, join("stage_input", to_name(var.self)))));
			}
			else if (var.storage == StorageClassOutput)
			{
				arguments.push_back(join("out ", variable_decl(type, join("stage_output", to_name(var.self)))));
			}
		}
	});

	auto &execution = get_entry_point();

	switch (execution.model)
	{
	case ExecutionModelGLCompute:
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		uint32_t x = execution.workgroup_size.x;
		uint32_t y = execution.workgroup_size.y;
		uint32_t z = execution.workgroup_size.z;

		auto x_expr = wg_x.id ? get<SPIRConstant>(wg_x.id).specialization_constant_macro_name : to_string(x);
		auto y_expr = wg_y.id ? get<SPIRConstant>(wg_y.id).specialization_constant_macro_name : to_string(y);
		auto z_expr = wg_z.id ? get<SPIRConstant>(wg_z.id).specialization_constant_macro_name : to_string(z);

		statement("[numthreads(", x_expr, ", ", y_expr, ", ", z_expr, ")]");
		break;
	}
	case ExecutionModelFragment:
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			statement("[earlydepthstencil]");
		break;
	default:
		break;
	}

	statement(require_output ? "SPIRV_Cross_Output " : "void ", "main(", merge(arguments), ")");
	begin_scope();
	bool legacy = hlsl_options.shader_model <= 30;

	// Copy builtins from entry point arguments to globals.
	active_input_builtins.for_each_bit([&](uint32_t i) {
		auto builtin = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassInput);
		switch (static_cast<BuiltIn>(i))
		{
		case BuiltInFragCoord:
			// VPOS in D3D9 is sampled at integer locations, apply half-pixel offset to be consistent.
			// TODO: Do we need an option here? Any reason why a D3D9 shader would be used
			// on a D3D10+ system with a different rasterization config?
			if (legacy)
				statement(builtin, " = stage_input.", builtin, " + float4(0.5f, 0.5f, 0.0f, 0.0f);");
			else
			{
				statement(builtin, " = stage_input.", builtin, ";");
				// ZW are undefined in D3D9, only do this fixup here.
				statement(builtin, ".w = 1.0 / ", builtin, ".w;");
			}
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			// D3D semantics are uint, but shader wants int.
			if (hlsl_options.support_nonzero_base_vertex_base_instance)
			{
				if (static_cast<BuiltIn>(i) == BuiltInInstanceIndex)
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseInstance;");
				else
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseVertex;");
			}
			else
				statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInInstanceId:
			// D3D semantics are uint, but shader wants int.
			statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
			break;

		case BuiltInSubgroupEqMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupEqMask = 1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96));");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupEqMask.x = 0;");
			statement("if (WaveGetLaneIndex() >= 64 || WaveGetLaneIndex() < 32) gl_SubgroupEqMask.y = 0;");
			statement("if (WaveGetLaneIndex() >= 96 || WaveGetLaneIndex() < 64) gl_SubgroupEqMask.z = 0;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupEqMask.w = 0;");
			break;

		case BuiltInSubgroupGeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupGeMask = ~((1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupGeMask.x = 0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupGeMask.y = 0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupGeMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupGeMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupGeMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupGeMask.w = ~0u;");
			break;

		case BuiltInSubgroupGtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint gt_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupGtMask = ~((1u << (gt_lane_index - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (gt_lane_index >= 32) gl_SubgroupGtMask.x = 0u;");
			statement("if (gt_lane_index >= 64) gl_SubgroupGtMask.y = 0u;");
			statement("if (gt_lane_index >= 96) gl_SubgroupGtMask.z = 0u;");
			statement("if (gt_lane_index >= 128) gl_SubgroupGtMask.w = 0u;");
			statement("if (gt_lane_index < 32) gl_SubgroupGtMask.y = ~0u;");
			statement("if (gt_lane_index < 64) gl_SubgroupGtMask.z = ~0u;");
			statement("if (gt_lane_index < 96) gl_SubgroupGtMask.w = ~0u;");
			break;

		case BuiltInSubgroupLeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint le_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupLeMask = (1u << (le_lane_index - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (le_lane_index >= 32) gl_SubgroupLeMask.x = ~0u;");
			statement("if (le_lane_index >= 64) gl_SubgroupLeMask.y = ~0u;");
			statement("if (le_lane_index >= 96) gl_SubgroupLeMask.z = ~0u;");
			statement("if (le_lane_index >= 128) gl_SubgroupLeMask.w = ~0u;");
			statement("if (le_lane_index < 32) gl_SubgroupLeMask.y = 0u;");
			statement("if (le_lane_index < 64) gl_SubgroupLeMask.z = 0u;");
			statement("if (le_lane_index < 96) gl_SubgroupLeMask.w = 0u;");
			break;

		case BuiltInSubgroupLtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupLtMask = (1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupLtMask.x = ~0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupLtMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupLtMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupLtMask.y = 0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupLtMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupLtMask.w = 0u;");
			break;

		case BuiltInClipDistance:
			for (uint32_t clip = 0; clip < clip_distance_count; clip++)
				statement("gl_ClipDistance[", clip, "] = stage_input.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3],
				          ";");
			break;

		case BuiltInCullDistance:
			for (uint32_t cull = 0; cull < cull_distance_count; cull++)
				statement("gl_CullDistance[", cull, "] = stage_input.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3],
				          ";");
			break;

		default:
			statement(builtin, " = stage_input.", builtin, ";");
			break;
		}
	});

	// Copy from stage input struct to globals.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

		if (var.storage != StorageClassInput)
			return;

		bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

		if (!block && !var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self))
		{
			auto name = to_name(var.self);
			auto &mtype = this->get<SPIRType>(var.basetype);
			if (need_matrix_unroll && mtype.columns > 1)
			{
				// Unroll matrices.
				for (uint32_t col = 0; col < mtype.columns; col++)
					statement(name, "[", col, "] = stage_input.", name, "_", col, ";");
			}
			else
			{
				statement(name, " = stage_input.", name, ";");
			}
		}

		// I/O blocks don't use the common stage input/output struct, but separate outputs.
		if (block && !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
		{
			auto name = to_name(var.self);
			statement(name, " = stage_input", name, ";");
		}
	});

	// Run the shader.
	if (execution.model == ExecutionModelVertex)
		statement("vert_main();");
	else if (execution.model == ExecutionModelFragment)
		statement("frag_main();");
	else if (execution.model == ExecutionModelGLCompute)
		statement("comp_main();");
	else
		SPIRV_CROSS_THROW("Unsupported shader stage.");

	// Copy block outputs.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

		if (var.storage != StorageClassOutput)
			return;

		// I/O blocks don't use the common stage input/output struct, but separate outputs.
		if (block && !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
		{
			auto name = to_name(var.self);
			statement("stage_output", name, " = ", name, ";");
		}
	});

	// Copy stage outputs.
	if (require_output)
	{
		statement("SPIRV_Cross_Output stage_output;");

		// Copy builtins from globals to return struct.
		active_output_builtins.for_each_bit([&](uint32_t i) {
			// PointSize doesn't exist in HLSL.
			if (i == BuiltInPointSize)
				return;

			switch (static_cast<BuiltIn>(i))
			{
			case BuiltInClipDistance:
				for (uint32_t clip = 0; clip < clip_distance_count; clip++)
					statement("stage_output.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3], " = gl_ClipDistance[",
					          clip, "];");
				break;

			case BuiltInCullDistance:
				for (uint32_t cull = 0; cull < cull_distance_count; cull++)
					statement("stage_output.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3], " = gl_CullDistance[",
					          cull, "];");
				break;

			default:
			{
				auto builtin_expr = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassOutput);
				statement("stage_output.", builtin_expr, " = ", builtin_expr, ";");
				break;
			}
			}
		});

		ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
			auto &type = this->get<SPIRType>(var.basetype);
			bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);

			if (var.storage != StorageClassOutput)
				return;

			if (!block && var.storage != StorageClassFunction && !var.remapped_variable && type.pointer &&
			    !is_builtin_variable(var) && interface_variable_exists_in_entry_point(var.self))
			{
				auto name = to_name(var.self);

				if (legacy && execution.model == ExecutionModelFragment)
				{
					string output_filler;
					for (uint32_t size = type.vecsize; size < 4; ++size)
						output_filler += ", 0.0";

					statement("stage_output.", name, " = float4(", name, output_filler, ");");
				}
				else
				{
					statement("stage_output.", name, " = ", name, ";");
				}
			}
		});

		statement("return stage_output;");
	}

	end_scope();
}